

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_file.c
# Opt level: O1

void LoadTriangles(Level *NewLev,int radius)

{
  Material *pMVar1;
  Edge *pEVar2;
  long lVar3;
  int iVar4;
  Triangle *t;
  Edge *pEVar5;
  long lVar6;
  bool bVar7;
  
  ExpectToken(TK_OPENBRACE);
  do {
    GetToken();
    if (Token.Type != TK_OPENBRACE) {
      if (Token.Type != TK_CLOSEBRACE) {
        Error = 1;
      }
      return;
    }
    t = NewTriangle();
    GetVert(NewLev,t,0);
    ExpectToken(TK_COMMA);
    GetVert(NewLev,t,1);
    ExpectToken(TK_COMMA);
    GetVert(NewLev,t,2);
    ExpectToken(TK_COMMA);
    ExpectToken(TK_NUMBER);
    iVar4 = Token.IQuantity;
    pMVar1 = NewLev->AllMats;
    t->Material = pMVar1;
    while (pMVar1 != (Material *)0x0) {
      bVar7 = iVar4 == 0;
      iVar4 = iVar4 + -1;
      if (bVar7) {
        Token.IQuantity = -1;
        break;
      }
      pMVar1 = pMVar1->Next;
      t->Material = pMVar1;
      Token.IQuantity = iVar4;
    }
    if (Token.IQuantity != -1) {
      Error = 1;
      snprintf(ErrorText,0x400,"Unknown material referenced at line %d",(ulong)(uint)Lines);
      return;
    }
    ExpectToken(TK_CLOSEBRACE);
    t->Next = NewLev->AllTris;
    NewLev->AllTris = t;
    lVar6 = 0;
    do {
      if ((*(byte *)((long)t->EdgeFlags + lVar6 * 4 + 9) & 1) != 0) {
        pEVar2 = NewLev->AllEdges;
        pEVar5 = NewEdge();
        NewLev->AllEdges = pEVar5;
        pEVar5->Material = t->Material;
        pEVar5->Next = pEVar2;
        lVar3 = lVar6 + 3;
        if ((int)lVar6 == 0) {
          lVar3 = lVar6;
        }
        pEVar5->EndPoints[0] = t->Edges[lVar6 + 2];
        NewLev->AllEdges->EndPoints[1] = t->Edges[(int)lVar3];
        pEVar2 = NewLev->AllEdges;
        GetNormal(pEVar2,pEVar2->EndPoints[0]->Pos,pEVar2->EndPoints[1]->Pos);
        pEVar2->c = (pEVar2->a * pEVar2->a + pEVar2->b * pEVar2->b) * -(double)radius + pEVar2->c;
        pEVar2->EndPoints[0]->Edges[pEVar2->EndPoints[0]->Edges[0] != (Edge *)0x0] = pEVar2;
        pEVar2->EndPoints[1]->Edges[pEVar2->EndPoints[1]->Edges[0] != (Edge *)0x0] = pEVar2;
      }
      lVar6 = lVar6 + -1;
    } while (lVar6 != -3);
  } while( true );
}

Assistant:

void LoadTriangles(struct Level *NewLev, int radius)
{
   struct Triangle *Tri;
   struct Edge *NextEdge;
   int c;

   ExpectToken(TK_OPENBRACE);
   while (1) {
      GetToken();
      switch (Token.Type) {
         case TK_CLOSEBRACE:
            return;
         case TK_OPENBRACE:
            {
               Tri = NewTriangle();

               /* read vertex pointers & edge flags */
               GetVert(NewLev, Tri, 0);
               ExpectToken(TK_COMMA);
               GetVert(NewLev, Tri, 1);
               ExpectToken(TK_COMMA);
               GetVert(NewLev, Tri, 2);
               ExpectToken(TK_COMMA);

               /* read material reference and store correct pointer */
               ExpectToken(TK_NUMBER);

               Tri->Material = NewLev->AllMats;
               while (Tri->Material && Token.IQuantity--)
                  Tri->Material = Tri->Material->Next;
               if (Token.IQuantity != -1) {
                  Error = 1;
                  snprintf(ErrorText, sizeof(ErrorText),
                            "Unknown material referenced at line %d", Lines);
                  return;
               }

               /* expect end of this triangle */
               ExpectToken(TK_CLOSEBRACE);

               /* insert new triangle into total level list */
               Tri->Next = NewLev->AllTris;
               NewLev->AllTris = Tri;

               /* generate edges */
               c = 3;
               while (c--) {
                  if (Tri->EdgeFlags[c] & FLAGS_COLLIDABLE) {
                     NextEdge = NewLev->AllEdges;
                     NewLev->AllEdges = NewEdge();
                     NewLev->AllEdges->Material = Tri->Material;
                     NewLev->AllEdges->Next = NextEdge;

                     NewLev->AllEdges->EndPoints[0] = Tri->Edges[c];
                     NewLev->AllEdges->EndPoints[1] = Tri->Edges[(c + 1) % 3];

                     InitEdge(NewLev->AllEdges, radius);
                  }
               }
            }
            break;
         default:
            Error = 1;
            return;
      }
   }
}